

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O1

uint64_t __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::GetHashCode(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
              *this,void *hasher)

{
  if (*(long *)((long)hasher + 0x18) - *(long *)((long)hasher + 0x10) == 8) {
    return *(uint64_t *)(*(long *)((long)hasher + 0x18) + -8);
  }
  __assert_fail("IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/schema.h"
                ,0x182,
                "uint64_t rapidjson::internal::Hasher<rapidjson::UTF8<>, rapidjson::CrtAllocator>::GetHashCode() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
               );
}

Assistant:

size_t GetSize() const { return static_cast<size_t>(stackTop_ - stack_); }